

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O2

void __thiscall andres::Partition<unsigned_long>::assign(Partition<unsigned_long> *this,Index size)

{
  pointer puVar1;
  Index j;
  Index IVar2;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->parents_,size);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->ranks_,size);
  this->numberOfSets_ = size;
  puVar1 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (IVar2 = 0; size != IVar2; IVar2 = IVar2 + 1) {
    puVar1[IVar2] = IVar2;
  }
  return;
}

Assistant:

inline void
Partition<T>::assign(
    const Index size
) {
    parents_.resize(static_cast<std::size_t>(size));
    ranks_.resize(static_cast<std::size_t>(size));
    numberOfSets_ = size;
    for(Index j = 0; j < size; ++j) {
        parents_[static_cast<std::size_t>(j)] = j;
    }
}